

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push
          (iterator *this,iter_result *e)

{
  node_ptr aleaf;
  
  aleaf.tagged_ptr = (e->node).tagged_ptr;
  if ((aleaf.tagged_ptr & 7) == 0) {
    push_leaf(this,aleaf);
    aleaf.tagged_ptr = (e->node).tagged_ptr;
  }
  push(this,aleaf,e->key_byte,e->child_index,e->prefix);
  return;
}

Assistant:

void push(const typename inode_base::iter_result& e) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        push_leaf(e.node);
      }
      push(e.node, e.key_byte, e.child_index, e.prefix);
    }